

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O2

QFileSystemEntry *
QFileSystemEngine::canonicalName
          (QFileSystemEntry *__return_storage_ptr__,QFileSystemEntry *entry,
          QFileSystemMetaData *data)

{
  byte *pbVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  char *data_00;
  int *piVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_1050;
  char stack_result [4097];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = QFileSystemEntry::isEmpty(entry);
  if ((bVar4) || (bVar4 = qIsFilenameBroken(entry), bVar4)) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,entry);
      return __return_storage_ptr__;
    }
  }
  else {
    memset(stack_result,0xaa,0x1001);
    QFileSystemEntry::nativeFilePath((NativePath *)&local_1050,entry);
    if (local_1050.ptr == (char *)0x0) {
      local_1050.ptr = "";
    }
    data_00 = realpath(local_1050.ptr,stack_result);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_1050);
    if (data_00 == (char *)0x0) {
      piVar5 = __errno_location();
      if ((*piVar5 == 0x14) || (*piVar5 == 2)) {
        pbVar1 = (byte *)((long)&(data->knownFlagsMask).
                                 super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
        *pbVar1 = *pbVar1 | 0x40;
        pbVar1 = (byte *)((long)&(data->entryFlags).
                                 super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                                 super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i + 2);
        *pbVar1 = *pbVar1 & 0xbf;
        QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__);
      }
      else {
        QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,entry);
      }
    }
    else {
      uVar2._0_4_ = data->knownFlagsMask;
      uVar2._4_4_ = data->entryFlags;
      data->knownFlagsMask = (MetaDataFlags)(int)(uVar2 | 0x40000000400000);
      data->entryFlags = (MetaDataFlags)(int)((uVar2 | 0x40000000400000) >> 0x20);
      QByteArray::QByteArray((QByteArray *)&local_1050,data_00,-1);
      QFileSystemEntry::QFileSystemEntry(__return_storage_ptr__,&local_1050);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_1050);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QFileSystemEntry QFileSystemEngine::canonicalName(const QFileSystemEntry &entry, QFileSystemMetaData &data)
{
    Q_CHECK_FILE_NAME(entry, entry);
    char *resolved_name = nullptr;

#ifdef PATH_MAX
    // use the stack to avoid the overhead of memory allocation
    char stack_result[PATH_MAX + 1];
#else
    // system with unlimited file paths -> must use heap
    std::nullptr_t stack_result = nullptr;
    auto freer = qScopeGuard([&] { free(resolved_name); });
#endif

# if defined(Q_OS_DARWIN) || defined(Q_OS_ANDROID)
    // On some Android and macOS versions, realpath() will return a path even if
    // it does not exist. To work around this, we check existence in advance.
    if (!data.hasFlags(QFileSystemMetaData::ExistsAttribute))
        fillMetaData(entry, data, QFileSystemMetaData::ExistsAttribute);

    if (!data.exists())
        errno = ENOENT;
    else
        resolved_name = realpath(entry.nativeFilePath().constData(), stack_result);
# else
    resolved_name = realpath(entry.nativeFilePath().constData(), stack_result);
# endif
    if (resolved_name) {
        data.knownFlagsMask |= QFileSystemMetaData::ExistsAttribute;
        data.entryFlags |= QFileSystemMetaData::ExistsAttribute;
        return QFileSystemEntry(resolved_name, QFileSystemEntry::FromNativePath{});
    } else if (errno == ENOENT || errno == ENOTDIR) { // file doesn't exist
        data.knownFlagsMask |= QFileSystemMetaData::ExistsAttribute;
        data.entryFlags &= ~(QFileSystemMetaData::ExistsAttribute);
        return QFileSystemEntry();
    }
    return entry;
}